

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

Role __thiscall QAccessibleButton::role(QAccessibleButton *this)

{
  bool bVar1;
  Role RVar2;
  QObject *object;
  QPushButton *this_00;
  QMenu *pQVar3;
  
  object = (QObject *)button(this);
  this_00 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>(object);
  if ((this_00 == (QPushButton *)0x0) ||
     (pQVar3 = QPushButton::menu(this_00), pQVar3 == (QMenu *)0x0)) {
    bVar1 = QAbstractButton::isCheckable((QAbstractButton *)object);
    if (bVar1) {
      bVar1 = QAbstractButton::autoExclusive((QAbstractButton *)object);
      RVar2 = bVar1 | CheckBox;
    }
    else {
      RVar2 = Button;
    }
  }
  else {
    RVar2 = ButtonMenu;
  }
  return RVar2;
}

Assistant:

QAccessible::Role QAccessibleButton::role() const
{
    QAbstractButton *ab = button();

#if QT_CONFIG(menu)
    if (QPushButton *pb = qobject_cast<QPushButton*>(ab)) {
        if (pb->menu())
            return QAccessible::ButtonMenu;
    }
#endif

    if (ab->isCheckable())
        return ab->autoExclusive() ? QAccessible::RadioButton : QAccessible::CheckBox;

    return QAccessible::Button;
}